

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O2

TestResult * receive_result_info_nofork(char *tcname,char *tname,int iter,int duration)

{
  test_result tVar1;
  TestResult *pTVar2;
  char *pcVar3;
  
  pTVar2 = receive_test_result(0);
  if (pTVar2 != (TestResult *)0x0) {
    pTVar2->tcname = tcname;
    pTVar2->tname = tname;
    pTVar2->iter = iter;
    pTVar2->duration = duration;
    if (pTVar2->msg == (char *)0x0) {
      pcVar3 = pass_msg();
      pTVar2->msg = pcVar3;
      tVar1 = CK_PASS;
    }
    else {
      tVar1 = CK_FAILURE;
    }
    pTVar2->rtype = tVar1;
    return pTVar2;
  }
  eprintf("Failed to receive test result",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
          ,0x1b8);
}

Assistant:

static TestResult *receive_result_info_nofork(const char *tcname,
                                              const char *tname,
                                              int iter, int duration)
{
    TestResult *tr;

    tr = receive_test_result(0);
    if(tr == NULL)
    {
        eprintf("Failed to receive test result", __FILE__, __LINE__);
    }
    else
    {
        tr->tcname = tcname;
        tr->tname = tname;
        tr->iter = iter;
        tr->duration = duration;
        set_nofork_info(tr);
    }

    return tr;
}